

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

void __thiscall OpenMD::OpenMDBitSet::flip(OpenMDBitSet *this,size_t fromIndex,size_t toIndex)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  lVar1 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  lVar3 = lVar1 + ((long)fromIndex / 0x40) * 8 +
          (ulong)((fromIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  uVar2 = (uint)fromIndex & 0x3f;
  std::transform<std::_Bit_iterator,std::_Bit_iterator,std::logical_not<bool>>
            (lVar3,uVar2,
             lVar1 + ((long)toIndex / 0x40) * 8 +
             (ulong)((toIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8,
             (uint)toIndex & 0x3f,lVar3,uVar2);
  return;
}

Assistant:

void OpenMDBitSet::flip(size_t fromIndex, size_t toIndex) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;

    std::transform(first, last, first, std::logical_not<bool>());
  }